

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void chold(double *A,int N)

{
  long lVar1;
  double alpha;
  double *C;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  int m;
  long lVar13;
  long lVar14;
  long lVar15;
  
  lVar13 = (long)N;
  lVar15 = lVar13 * 8;
  C = (double *)malloc(lVar15 * lVar13);
  pdVar12 = A + (N + 1);
  lVar7 = lVar13;
  pdVar9 = A;
  lVar11 = lVar13;
  while( true ) {
    lVar11 = lVar11 + -1;
    lVar1 = lVar7 + -1;
    lVar14 = 0;
    if (0 < lVar1) {
      lVar14 = lVar1;
    }
    if (lVar7 == 1) break;
    alpha = *pdVar9;
    for (lVar4 = 1; lVar4 < lVar7; lVar4 = lVar4 + 1) {
      pdVar9[lVar4] = pdVar9[lVar4] / alpha;
    }
    m = (int)lVar1;
    mmult(pdVar9 + 1,pdVar9 + 1,C,m,1,m);
    scale(C,m,m,alpha);
    pdVar2 = C;
    pdVar5 = pdVar12;
    lVar7 = lVar11;
    for (lVar4 = 0; lVar4 != lVar14; lVar4 = lVar4 + 1) {
      for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
        pdVar5[lVar10] = pdVar5[lVar10] - pdVar2[lVar10];
      }
      lVar7 = lVar7 + -1;
      pdVar5 = pdVar5 + lVar13 + 1;
      pdVar2 = (double *)((long)pdVar2 + lVar15);
    }
    pdVar9 = pdVar9 + lVar13 + 1;
    pdVar12 = pdVar12 + lVar13 + 1;
    lVar15 = lVar15 + -8;
    lVar7 = lVar1;
  }
  uVar3 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      A[uVar8] = 0.0;
    }
    A = A + lVar13;
  }
  free(C);
  return;
}

Assistant:

void chold(double *A, int N) {
	int stride,i,j,t;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	rchold(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	
}